

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O0

int strcpy_s(char *dst,size_t dstSizeInBytes,char *src)

{
  size_t sVar1;
  size_t neededBuffer;
  int result;
  char *src_local;
  size_t dstSizeInBytes_local;
  char *dst_local;
  
  if (dst == (char *)0x0) {
    neededBuffer._4_4_ = 0x16;
  }
  else if (src == (char *)0x0) {
    *dst = '\0';
    neededBuffer._4_4_ = 0x16;
  }
  else if (dstSizeInBytes == 0) {
    *dst = '\0';
    neededBuffer._4_4_ = 0x22;
  }
  else {
    sVar1 = strlen(src);
    if (dstSizeInBytes < sVar1 + 1) {
      *dst = '\0';
      neededBuffer._4_4_ = 0x22;
    }
    else {
      memcpy(dst,src,sVar1 + 1);
      neededBuffer._4_4_ = 0;
    }
  }
  return neededBuffer._4_4_;
}

Assistant:

int strcpy_s(char* dst, size_t dstSizeInBytes, const char* src)
{
    int result;

    /* Codes_SRS_CRT_ABSTRACTIONS_99_012: [If dst is NULL, the error code returned shall be EINVAL & dst shall not be modified.]*/
    if (dst == NULL)
    {
        result = EINVAL;
    }
    /* Codes_SRS_CRT_ABSTRACTIONS_99_013: [If src is NULL, the error code returned shall be EINVAL and dst[0] shall be set to 0.]*/
    else if (src == NULL)
    {
        dst[0] = '\0';
        result = EINVAL;
    }
    /* Codes_SRS_CRT_ABSTRACTIONS_99_014: [If the dstSizeInBytes is 0 or smaller than the required size for the src string, the error code returned shall be ERANGE & dst[0] set to 0.]*/
    else if (dstSizeInBytes == 0)
    {
        dst[0] = '\0';
        result = ERANGE;
    }
    else
    {
        size_t neededBuffer = strlen(src);
        /* Codes_SRS_CRT_ABSTRACTIONS_99_014: [If the dstSizeInBytes is 0 or smaller than the required size for the src string, the error code returned shall be ERANGE & dst[0] set to 0.]*/
        if (neededBuffer + 1 > dstSizeInBytes)
        {
            dst[0] = '\0';
            result = ERANGE;
        }
        else
        {
            (void)memcpy(dst, src, neededBuffer + 1);
            /*Codes_SRS_CRT_ABSTRACTIONS_99_011: [strcpy_s shall return Zero upon success]*/
            result = 0;
        }
    }

    return result;
}